

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticket-translation.cpp
# Opt level: O3

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
validity(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
         *__return_storage_ptr__,field *f)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  unsigned_long uVar3;
  long lVar4;
  uint64_t i;
  unsigned_long local_50;
  unsigned_long local_48 [4];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar4 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48[0] = (f->ranges).first.first;
  local_48[1] = (f->ranges).first.second;
  local_48[2] = (f->ranges).second.first;
  local_48[3] = (f->ranges).second.second;
  do {
    lVar2 = *(long *)((long)local_48 + lVar4 + 8);
    for (uVar3 = *(unsigned_long *)((long)local_48 + lVar4); uVar3 != lVar2 + 1U; uVar3 = uVar3 + 1)
    {
      local_50 = uVar3;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_emplace_unique<unsigned_long&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)__return_storage_ptr__,&local_50);
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x20);
  return __return_storage_ptr__;
}

Assistant:

auto validity(const puzzle::field & f) {
  std::set<uint64_t> valid;
  for (const auto& r : { f.ranges.first, f.ranges.second }) {
    for (uint64_t i : std::views::iota(r.first, r.second+1))
      valid.emplace(i);
  }
  return valid;
}